

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3NotPureFunc(sqlite3_context *pCtx)

{
  Op *pOVar1;
  char *z;
  char *zMsg;
  char *zContext;
  VdbeOp *pOp;
  sqlite3_context *pCtx_local;
  
  pOVar1 = pCtx->pVdbe->aOp + pCtx->iOp;
  if (pOVar1->opcode == 'A') {
    if ((pOVar1->p5 & 4) == 0) {
      if ((pOVar1->p5 & 8) == 0) {
        zMsg = "an index";
      }
      else {
        zMsg = "a generated column";
      }
    }
    else {
      zMsg = "a CHECK constraint";
    }
    z = sqlite3_mprintf("non-deterministic use of %s() in %s",pCtx->pFunc->zName,zMsg);
    sqlite3_result_error(pCtx,z,-1);
    sqlite3_free(z);
    pCtx_local._4_4_ = 0;
  }
  else {
    pCtx_local._4_4_ = 1;
  }
  return pCtx_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3NotPureFunc(sqlite3_context *pCtx){
  const VdbeOp *pOp;
#ifdef SQLITE_ENABLE_STAT4
  if( pCtx->pVdbe==0 ) return 1;
#endif
  pOp = pCtx->pVdbe->aOp + pCtx->iOp;
  if( pOp->opcode==OP_PureFunc ){
    const char *zContext;
    char *zMsg;
    if( pOp->p5 & NC_IsCheck ){
      zContext = "a CHECK constraint";
    }else if( pOp->p5 & NC_GenCol ){
      zContext = "a generated column";
    }else{
      zContext = "an index";
    }
    zMsg = sqlite3_mprintf("non-deterministic use of %s() in %s",
                           pCtx->pFunc->zName, zContext);
    sqlite3_result_error(pCtx, zMsg, -1);
    sqlite3_free(zMsg);
    return 0;
  }
  return 1;
}